

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O2

void __thiscall Storage::Disk::Drive::set_disk(Drive *this,shared_ptr<Storage::Disk::Disk> *disk)

{
  element_type *peVar1;
  
  if (this->ready_type_ - ShugartModifiedRDY < 2) {
    this->is_ready_ = false;
  }
  peVar1 = (this->disk_).super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*peVar1->_vptr_Disk[6])(peVar1);
  }
  std::__shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->disk_).super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>,
             &disk->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>);
  this->has_disk_ =
       (this->disk_).super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0;
  invalidate_track(this);
  (*(this->super_Source)._vptr_Source[4])(this,(ulong)(peVar1 != (element_type *)0x0));
  ClockingHint::Source::update_clocking_observer(&this->super_Source);
  return;
}

Assistant:

void Drive::set_disk(const std::shared_ptr<Disk> &disk) {
	if(ready_type_ == ReadyType::ShugartModifiedRDY || ready_type_ == ReadyType::IBMRDY) {
		is_ready_ = false;
	}
	const bool had_disk = bool(disk_);
	if(disk_) disk_->flush_tracks();
	disk_ = disk;
	has_disk_ = !!disk_;

	invalidate_track();
	did_set_disk(had_disk);
	update_clocking_observer();
}